

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char_const(&)[33],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string>
                   (string *__return_storage_ptr__,char (*a) [33],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [4],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_170;
  cmAlphaNum local_138;
  cmAlphaNum local_100;
  cmAlphaNum local_c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_90;
  string_view local_78;
  string *local_68;
  string_view local_60;
  string *local_50;
  string_view local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  cmAlphaNum::cmAlphaNum(&local_c8,*a);
  local_90.first = cmAlphaNum::View(&local_c8);
  local_90.second = local_c8.RValueString_;
  local_100.RValueString_ = (string *)0x0;
  local_100.View_._M_str = (b->_M_dataplus)._M_p;
  local_100.View_._M_len = b->_M_string_length;
  local_78 = cmAlphaNum::View(&local_100);
  local_68 = local_100.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_138,*args);
  local_60 = cmAlphaNum::View(&local_138);
  local_50 = local_138.RValueString_;
  local_170.View_._M_len = 0;
  local_170.View_._M_str = (char *)0x0;
  local_170.RValueString_ = args_1;
  local_48 = cmAlphaNum::View(&local_170);
  local_38 = local_170.RValueString_;
  views._M_len = 4;
  views._M_array = &local_90;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}